

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_argsof_lambda_auto.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 local_48 [8];
  tst_cpp14_argsof_lambda_auto tc;
  QCoreApplication local_28 [8];
  QCoreApplication app;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  argv_local._0_4_ = argc;
  QTest::Internal::callInitMain<tst_cpp14_argsof_lambda_auto>();
  QCoreApplication::QCoreApplication(local_28,(int *)&argv_local,argv,0x60204);
  QCoreApplication::setAttribute(AA_Use96Dpi,true);
  tst_cpp14_argsof_lambda_auto::tst_cpp14_argsof_lambda_auto
            ((tst_cpp14_argsof_lambda_auto *)local_48);
  QTest::setMainSourcePath
            ("/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/cpp14/tst_argsof_lambda_auto.cpp"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/build_O0/tests/auto/qtpromise/cpp14"
            );
  argv_local._4_4_ = QTest::qExec((QObject *)local_48,(int)argv_local,argv);
  tst_cpp14_argsof_lambda_auto::~tst_cpp14_argsof_lambda_auto
            ((tst_cpp14_argsof_lambda_auto *)local_48);
  QCoreApplication::~QCoreApplication(local_28);
  return argv_local._4_4_;
}

Assistant:

void tst_cpp14_argsof_lambda_auto::lambdaAutoArgs()
{
    auto lOneArg = [](auto) {};
    auto lManyArgs = [](const auto&, auto, auto) {};
    auto lMutable = [](const auto&, auto) mutable {};

    Q_STATIC_ASSERT((ArgsOf<decltype(lOneArg)>::count == 0));
    Q_STATIC_ASSERT((ArgsOf<decltype(lManyArgs)>::count == 0));
    Q_STATIC_ASSERT((ArgsOf<decltype(lMutable)>::count == 0));
}